

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane3d.h
# Opt level: O2

bool __thiscall
irr::core::plane3d<float>::getIntersectionWithLine
          (plane3d<float> *this,vector3d<float> *linePoint,vector3d<float> *lineVect,
          vector3d<float> *outIntersection)

{
  float fVar1;
  float fVar2;
  vector3d<float> vVar3;
  vector3d<float> local_30;
  
  fVar1 = vector3d<float>::dotProduct(&this->Normal,lineVect);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = vector3d<float>::dotProduct(&this->Normal,linePoint);
    vVar3 = vector3d<float>::operator*(lineVect,-(fVar2 + this->D) / fVar1);
    local_30.Z = vVar3.Z;
    local_30._0_8_ = vVar3._0_8_;
    vVar3 = vector3d<float>::operator+(linePoint,&local_30);
    outIntersection->X = (float)(int)vVar3._0_8_;
    outIntersection->Y = (float)(int)((ulong)vVar3._0_8_ >> 0x20);
    outIntersection->Z = vVar3.Z;
  }
  return (bool)(-(fVar1 != 0.0) & 1);
}

Assistant:

bool getIntersectionWithLine(const vector3d<T> &linePoint,
			const vector3d<T> &lineVect,
			vector3d<T> &outIntersection) const
	{
		T t2 = Normal.dotProduct(lineVect);

		if (t2 == 0)
			return false;

		T t = -(Normal.dotProduct(linePoint) + D) / t2;
		outIntersection = linePoint + (lineVect * t);
		return true;
	}